

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

int __thiscall
btAlignedObjectArray<btBvhSubtreeInfo>::copy
          (btAlignedObjectArray<btBvhSubtreeInfo> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  long in_RCX;
  int i;
  long lVar7;
  
  lVar6 = (long)(int)dst;
  lVar7 = lVar6 << 5;
  for (; lVar6 < (int)src; lVar6 = lVar6 + 1) {
    puVar1 = (undefined8 *)((long)this->m_data->m_quantizedAabbMin + lVar7);
    uVar3 = *puVar1;
    uVar4 = puVar1[1];
    puVar1 = (undefined8 *)((long)this->m_data->m_padding + lVar7 + -4);
    uVar5 = puVar1[1];
    puVar2 = (undefined8 *)(in_RCX + 0x10 + lVar7);
    *puVar2 = *puVar1;
    puVar2[1] = uVar5;
    *(undefined8 *)(in_RCX + lVar7) = uVar3;
    ((undefined8 *)(in_RCX + lVar7))[1] = uVar4;
    lVar7 = lVar7 + 0x20;
  }
  return (int)lVar6;
}

Assistant:

SIMD_FORCE_INLINE	void	copy(int start,int end, T* dest) const
		{
			int i;
			for (i=start;i<end;++i)
#ifdef BT_USE_PLACEMENT_NEW
				new (&dest[i]) T(m_data[i]);
#else
				dest[i] = m_data[i];
#endif //BT_USE_PLACEMENT_NEW
		}